

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_NodeAndNeighbors *
leb__NodeAndNeighborsFromSameDepthNeighborIDs
          (leb_NodeAndNeighbors *__return_storage_ptr__,leb_Heap *leb,
          leb_SameDepthNeighborIDs nodeIDs,int nodeDepth)

{
  bool bVar1;
  leb_Node lVar2;
  int nodeDepth_local;
  leb_Heap *leb_local;
  leb_SameDepthNeighborIDs nodeIDs_local;
  
  leb_local._0_4_ = nodeIDs.left;
  (__return_storage_ptr__->left).id = (uint32_t)leb_local;
  (__return_storage_ptr__->left).depth = nodeDepth;
  leb_local._4_4_ = nodeIDs.right;
  (__return_storage_ptr__->right).id = leb_local._4_4_;
  (__return_storage_ptr__->right).depth = nodeDepth;
  nodeIDs_local.left = nodeIDs.edge;
  (__return_storage_ptr__->edge).id = nodeIDs_local.left;
  (__return_storage_ptr__->edge).depth = nodeDepth;
  nodeIDs_local.right = nodeIDs._reserved;
  (__return_storage_ptr__->node).id = nodeIDs_local.right;
  (__return_storage_ptr__->node).depth = nodeDepth;
  bVar1 = leb_IsLeafNode(leb,__return_storage_ptr__->edge);
  if (!bVar1) {
    lVar2 = leb_ParentNode(__return_storage_ptr__->edge);
    __return_storage_ptr__->edge = lVar2;
  }
  bVar1 = leb_IsLeafNode(leb,__return_storage_ptr__->left);
  if (!bVar1) {
    lVar2 = leb__RightChildNode(__return_storage_ptr__->left);
    __return_storage_ptr__->left = lVar2;
  }
  bVar1 = leb_IsLeafNode(leb,__return_storage_ptr__->right);
  if (!bVar1) {
    lVar2 = leb__LeftChildNode(__return_storage_ptr__->right);
    __return_storage_ptr__->right = lVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static leb_NodeAndNeighbors
leb__NodeAndNeighborsFromSameDepthNeighborIDs(
    const leb_Heap *leb,
    const leb_SameDepthNeighborIDs nodeIDs,
    int nodeDepth
) {
    leb_NodeAndNeighbors nodeData = {
        {nodeIDs.left, nodeDepth},
        {nodeIDs.right, nodeDepth},
        {nodeIDs.edge, nodeDepth},
        {nodeIDs._reserved, nodeDepth}
    };

    if (!leb_IsLeafNode(leb, nodeData.edge))
        nodeData.edge = leb_ParentNode(nodeData.edge);

    if (!leb_IsLeafNode(leb, nodeData.left))
        nodeData.left = leb__RightChildNode(nodeData.left);

    if (!leb_IsLeafNode(leb, nodeData.right))
        nodeData.right = leb__LeftChildNode(nodeData.right);

    return nodeData;
}